

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PZMatrixMarket.cpp
# Opt level: O2

void TPZMatrixMarket::Read<std::complex<double>>
               (string *filename,TPZFMatrix<std::complex<double>_> *fmat)

{
  istream *piVar1;
  int64_t el_1;
  int64_t el;
  long lVar2;
  long lVar3;
  long lVar4;
  int64_t col;
  int64_t row;
  int64_t nonzero;
  int64_t ncol;
  int64_t nrow;
  undefined8 local_278;
  undefined8 uStack_270;
  string *local_260;
  string buf;
  ifstream input;
  
  local_260 = filename;
  std::ifstream::ifstream((istream *)&input,(filename->_M_dataplus)._M_p,_S_in);
  buf._M_dataplus._M_p = (pointer)&buf.field_2;
  buf._M_string_length = 0;
  buf.field_2._M_local_buf[0] = '\0';
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&input,(string *)&buf);
  piVar1 = std::istream::_M_extract<long>((long *)&input);
  piVar1 = std::istream::_M_extract<long>((long *)piVar1);
  std::istream::_M_extract<long>((long *)piVar1);
  (*(fmat->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable[0xe])(fmat,nrow,ncol);
  lVar3 = 0;
  lVar4 = 0;
  for (lVar2 = 0; lVar2 < 0; lVar2 = lVar2 + 1) {
    local_278 = 0;
    uStack_270 = 0;
    piVar1 = std::istream::_M_extract<long>((long *)&input);
    piVar1 = std::istream::_M_extract<long>((long *)piVar1);
    std::operator>>(piVar1,(complex *)&local_278);
    (*(fmat->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0x23])();
    lVar4 = lVar4 + (ulong)(row < col);
    lVar3 = lVar3 + (ulong)(col < row);
    col = col + -1;
    row = row + -1;
  }
  std::__cxx11::string::~string((string *)&buf);
  std::ifstream::~ifstream(&input);
  if ((lVar4 == 0) || (lVar3 == 0)) {
    std::ifstream::ifstream((istream *)&input,(string *)local_260,_S_in);
    buf._M_dataplus._M_p = (pointer)&buf.field_2;
    buf._M_string_length = 0;
    buf.field_2._M_local_buf[0] = '\0';
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&input,(string *)&buf)
    ;
    piVar1 = std::istream::_M_extract<long>((long *)&input);
    piVar1 = std::istream::_M_extract<long>((long *)piVar1);
    std::istream::_M_extract<long>((long *)piVar1);
    (*(fmat->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0xe])(fmat,nrow,ncol);
    for (lVar2 = 0; lVar2 < 0; lVar2 = lVar2 + 1) {
      local_278 = 0;
      uStack_270 = 0;
      piVar1 = std::istream::_M_extract<long>((long *)&input);
      piVar1 = std::istream::_M_extract<long>((long *)piVar1);
      std::operator>>(piVar1,(complex *)&local_278);
      (*(fmat->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0x23])();
    }
    std::__cxx11::string::~string((string *)&buf);
    std::ifstream::~ifstream(&input);
  }
  return;
}

Assistant:

void TPZMatrixMarket::Read(std::string filename, TPZFMatrix<T>&fmat)
{
    int64_t nrow,ncol,nonzero=0,nsup=0,nlower=0;
    {
        std::ifstream input(filename.c_str());
        std::string buf;
        std::getline(input,buf);
        input >> nrow >> ncol >> nonzero;
        fmat.Redim(nrow,ncol);
        for (int64_t el=0; el<nonzero; el++) {
            int64_t row, col;
            T val;
            input >> row >> col >> val;
            row--;
            col--;
            if(row > col) nlower++;
            if(row< col ) nsup++;
            fmat.PutVal(row,col,val);
        }
    }
    if(nsup == 0 || nlower == 0)
    {
        std::ifstream input(filename);
        std::string buf;
        std::getline(input,buf);
        input >> nrow >> ncol >> nonzero;
        fmat.Redim(nrow,ncol);
        for (int64_t el=0; el<nonzero; el++) {
            int64_t row, col;
            T val;
            input >> row >> col >> val;
            row--;
            col--;
            int64_t swap = row;
            row = col;
            col = swap;
            fmat.PutVal(row,col,val);
        }
    }
}